

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SMBusSimulationDataGenerator::OutputWriteByte
          (SMBusSimulationDataGenerator *this,U8 command,U8 data_byte)

{
  U8 byte;
  bool is_ack;
  char cVar1;
  
  OutputStart(this);
  OutputByte(this,0x86,true);
  OutputByte(this,command,true);
  is_ack = (bool)AnalyzerSettingInterfaceBool::GetValue();
  OutputByte(this,data_byte,is_ack);
  byte = ""[""[command ^ 0x9b] ^ data_byte];
  cVar1 = AnalyzerSettingInterfaceBool::GetValue();
  if (cVar1 != '\0') {
    OutputByte(this,byte,false);
  }
  OutputStop(this);
  ClockGenerator::AdvanceByTimeS(0.0005);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputWriteByte( U8 command, U8 data_byte )
{
    U8 pec = 0;

    OutputStart();
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( command ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( data_byte, mSettings->CalcPEC() ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec, false );
    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}